

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

SquareMatrix<2> pbrt::operator*(SquareMatrix<2> *m1,SquareMatrix<2> *m2)

{
  Float FVar1;
  Float aFVar2 [2];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  long lVar6;
  Float (*paFVar7) [2];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  SquareMatrix<2> r;
  SquareMatrix<2> local_28;
  
  SquareMatrix<2>::SquareMatrix(&local_28);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = m2->m[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = m2->m[1];
  lVar6 = 0;
  paFVar7 = (Float (*) [2])&local_28;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    FVar1 = m1->m[lVar6][0];
    auVar8._4_4_ = FVar1;
    auVar8._0_4_ = FVar1;
    auVar8._8_4_ = FVar1;
    auVar8._12_4_ = FVar1;
    auVar8 = vfmadd132ps_fma(auVar8,ZEXT816(0) << 0x40,auVar9);
    FVar1 = m1->m[lVar6][1];
    auVar3._4_4_ = FVar1;
    auVar3._0_4_ = FVar1;
    auVar3._8_4_ = FVar1;
    auVar3._12_4_ = FVar1;
    auVar8 = vfmadd231ps_avx512vl(auVar8,auVar10,auVar3);
    lVar6 = 1;
    aFVar2 = (Float  [2])vmovlps_avx(auVar8);
    *paFVar7 = aFVar2;
    paFVar7 = local_28.m + 1;
    bVar4 = false;
  } while (bVar5);
  return (SquareMatrix<2>)local_28.m;
}

Assistant:

PBRT_CPU_GPU inline SquareMatrix<N> operator*(const SquareMatrix<N> &m1,
                                              const SquareMatrix<N> &m2) {
    SquareMatrix<N> r;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j) {
            r[i][j] = 0;
            for (int k = 0; k < N; ++k)
                r[i][j] = FMA(m1[i][k], m2[k][j], r[i][j]);
        }
    return r;
}